

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void __thiscall
jessilib::format_not_available::format_not_available(format_not_available *this,string *in_format)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"Format \"",in_format);
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_30,"\"not recognized");
  local_50 = (size_type *)(pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50 == paVar2) {
    local_40 = paVar2->_M_allocated_capacity;
    uStack_38 = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_50 = &local_40;
  }
  else {
    local_40 = paVar2->_M_allocated_capacity;
  }
  local_48 = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_001b3128;
  return;
}

Assistant:

format_not_available::format_not_available(const std::string& in_format)
	: std::runtime_error{ "Format \"" + in_format + "\"not recognized" } {
	// Empty ctor body
}